

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

void __thiscall
Component_addComponentToItself_Test::TestBody(Component_addComponentToItself_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ComponentPtr component;
  long *local_60;
  long *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertionResult local_48;
  long local_38 [2];
  AssertHelper local_28 [8];
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Component::create();
  psVar1 = local_20;
  local_48._0_8_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"component","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_48._0_8_ != local_38) {
    operator_delete((void *)local_48._0_8_,local_38[0] + 1);
  }
  local_58 = (long *)0x0;
  local_60 = (long *)libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_48,"size_t(0)","component->componentCount()",
             (unsigned_long *)&local_58,(unsigned_long *)&local_60);
  if ((string)local_48.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_58 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar2 = libcellml::ComponentEntity::addComponent((shared_ptr *)local_20);
  local_58 = (long *)(CONCAT71(local_58._1_7_,cVar2) ^ 1);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(char *)&local_58,"component->addComponent(component)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x86,(char *)local_48._0_8_);
    testing::internal::AssertHelper::operator=(local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(local_28);
    if ((long *)local_48._0_8_ != local_38) {
      operator_delete((void *)local_48._0_8_,local_38[0] + 1);
    }
    if (local_60 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_60 != (long *)0x0)) {
        (**(code **)(*local_60 + 8))();
      }
      local_60 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58 = (long *)0x0;
  local_60 = (long *)libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_48,"size_t(0)","component->componentCount()",
             (unsigned_long *)&local_58,(unsigned_long *)&local_60);
  if ((string)local_48.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_58 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Component, addComponentToItself)
{
    libcellml::ComponentPtr component = libcellml::Component::create();
    component->setName("component");

    EXPECT_EQ(size_t(0), component->componentCount());

    EXPECT_FALSE(component->addComponent(component));
    EXPECT_EQ(size_t(0), component->componentCount());
}